

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pznoderep.h
# Opt level: O3

void __thiscall
pzgeom::TPZNodeRep<4,_pztopology::TPZQuadrilateral>::Initialize
          (TPZNodeRep<4,_pztopology::TPZQuadrilateral> *this,TPZVec<long> *nodeindexes)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ostream *this_00;
  size_t sVar5;
  stringstream sout;
  long *local_1c8;
  long local_1b8 [2];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  if ((3 < nodeindexes->fNElements) && (nodeindexes->fNElements == 4)) {
    plVar1 = nodeindexes->fStore;
    lVar2 = *plVar1;
    lVar3 = plVar1[1];
    lVar4 = plVar1[3];
    this->fNodeIndexes[2] = plVar1[2];
    this->fNodeIndexes[3] = lVar4;
    this->fNodeIndexes[0] = lVar2;
    this->fNodeIndexes[1] = lVar3;
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,
             "void pzgeom::TPZNodeRep<4, pztopology::TPZQuadrilateral>::Initialize(TPZVec<int64_t> &) [N = 4, Topology = pztopology::TPZQuadrilateral]"
             ,0x88);
  std::__ostream_insert<char,std::char_traits<char>>(local_198," Nodeindexes have wrong size ",0x1d)
  ;
  this_00 = std::ostream::_M_insert<long>((long)local_198);
  std::__ostream_insert<char,std::char_traits<char>>(this_00," but should be ",0xf);
  std::ostream::operator<<(this_00,4);
  std::__cxx11::stringbuf::str();
  if (local_1c8 == (long *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1a342a8);
  }
  else {
    sVar5 = strlen((char *)local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)local_1c8,sVar5);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/pznoderep.h",
             0x71);
}

Assistant:

void Initialize(TPZVec<int64_t> &nodeindexes)
        {
            int64_t nn = nodeindexes.NElements() < N ? nodeindexes.NElements() : N;
#ifndef PZNODEBUG
            if(nodeindexes.NElements() != N)
            {
                std::stringstream sout;
                sout << __PRETTY_FUNCTION__ << " Nodeindexes have wrong size " << nodeindexes.NElements() << " but should be " << N;
                std::cout << sout.str().c_str() << std::endl;
                DebugStop();
            }
#endif
            memcpy(fNodeIndexes,&nodeindexes[0],nn*sizeof(int64_t));
            int64_t i;
            for(i=nn; i<N; i++) fNodeIndexes[i]=-1;
            
        }